

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O2

void tonk::SetTonkAddressStr(TonkAddress *addrOut,UDPAddress *addrIn)

{
  uint16_t uVar1;
  size_t i_1;
  size_type sVar2;
  size_t i;
  size_type sVar3;
  bool bVar4;
  address ip_addr;
  string addrstr;
  
  uVar1 = swap_bytes((addrIn->impl_).data_.v4.sin_port);
  addrOut->UDPPort = uVar1;
  bVar4 = (addrIn->impl_).data_.base.sa_family != 2;
  if (bVar4) {
    ip_addr.ipv6_address_.addr_.__in6_u._0_8_ = *(undefined8 *)((long)&(addrIn->impl_).data_ + 8);
    ip_addr.ipv6_address_.addr_.__in6_u._8_8_ = *(undefined8 *)((long)&(addrIn->impl_).data_ + 0x10)
    ;
    ip_addr.ipv6_address_.scope_id_ = (unsigned_long)(addrIn->impl_).data_.v6.sin6_scope_id;
    ip_addr.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
  }
  else {
    ip_addr.ipv4_address_.addr_.s_addr = (in4_addr_type)(addrIn->impl_).data_.v4.sin_addr.s_addr;
    ip_addr.ipv6_address_.scope_id_ = 0;
    ip_addr.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    ip_addr.ipv6_address_.addr_.__in6_u._8_8_ = 0;
  }
  ip_addr.type_ = (anon_enum_32)bVar4;
  bVar4 = asio::ip::address::is_unspecified(&ip_addr);
  if (bVar4) {
    addrOut->NetworkString[0x20] = '\0';
    addrOut->NetworkString[0x21] = '\0';
    addrOut->NetworkString[0x22] = '\0';
    addrOut->NetworkString[0x23] = '\0';
    addrOut->NetworkString[0x24] = '\0';
    addrOut->NetworkString[0x25] = '\0';
    addrOut->NetworkString[0x26] = '\0';
    addrOut->NetworkString[0x27] = '\0';
    addrOut->NetworkString[0] = '\0';
    addrOut->NetworkString[1] = '\0';
    addrOut->NetworkString[2] = '\0';
    addrOut->NetworkString[3] = '\0';
    addrOut->NetworkString[4] = '\0';
    addrOut->NetworkString[5] = '\0';
    addrOut->NetworkString[6] = '\0';
    addrOut->NetworkString[7] = '\0';
    addrOut->NetworkString[8] = '\0';
    addrOut->NetworkString[9] = '\0';
    addrOut->NetworkString[10] = '\0';
    addrOut->NetworkString[0xb] = '\0';
    addrOut->NetworkString[0xc] = '\0';
    addrOut->NetworkString[0xd] = '\0';
    addrOut->NetworkString[0xe] = '\0';
    addrOut->NetworkString[0xf] = '\0';
    addrOut->NetworkString[0x10] = '\0';
    addrOut->NetworkString[0x11] = '\0';
    addrOut->NetworkString[0x12] = '\0';
    addrOut->NetworkString[0x13] = '\0';
    addrOut->NetworkString[0x14] = '\0';
    addrOut->NetworkString[0x15] = '\0';
    addrOut->NetworkString[0x16] = '\0';
    addrOut->NetworkString[0x17] = '\0';
    addrOut->NetworkString[0x18] = '\0';
    addrOut->NetworkString[0x19] = '\0';
    addrOut->NetworkString[0x1a] = '\0';
    addrOut->NetworkString[0x1b] = '\0';
    addrOut->NetworkString[0x1c] = '\0';
    addrOut->NetworkString[0x1d] = '\0';
    addrOut->NetworkString[0x1e] = '\0';
    addrOut->NetworkString[0x1f] = '\0';
  }
  else {
    asio::ip::address::to_string_abi_cxx11_(&addrstr,&ip_addr);
    sVar2 = 0x27;
    if (addrstr._M_string_length < 0x27) {
      sVar2 = addrstr._M_string_length;
    }
    for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
      addrOut->NetworkString[sVar3] = addrstr._M_dataplus._M_p[sVar3];
    }
    for (; sVar2 != 0x28; sVar2 = sVar2 + 1) {
      addrOut->NetworkString[sVar2] = '\0';
    }
    std::__cxx11::string::~string((string *)&addrstr);
  }
  return;
}

Assistant:

void SetTonkAddressStr(TonkAddress& addrOut, const UDPAddress& addrIn)
{
    addrOut.UDPPort = addrIn.port();

    const auto ip_addr = addrIn.address();
    if (ip_addr.is_unspecified())
    {
        memset(addrOut.NetworkString, 0, sizeof(addrOut.NetworkString));
        return;
    }

    const std::string addrstr = ip_addr.to_string();

    size_t slen = addrstr.size();
    if (slen > TONK_IP_STRING_MAX_CHARS)
        slen = TONK_IP_STRING_MAX_CHARS;
    static_assert(sizeof(addrOut.NetworkString) == TONK_IP_STRING_BYTES, "Update this");

    for (size_t i = 0; i < slen; ++i)
        addrOut.NetworkString[i] = addrstr[i];
    for (size_t i = slen; i < TONK_IP_STRING_BYTES; ++i)
        addrOut.NetworkString[i] = '\0';
}